

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::BinaryReadError::BinaryReadError
          (BinaryReadError *this,string *filename,size_t offset,CStringRef message)

{
  undefined8 in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  int unaff_retaddr;
  Error *in_stack_00000008;
  CStringRef in_stack_00000010;
  
  Error::Error(in_stack_00000008,in_stack_00000010,unaff_retaddr);
  *in_RDI = &PTR__BinaryReadError_002317f0;
  std::__cxx11::string::string((string *)(in_RDI + 3),in_RSI);
  in_RDI[7] = in_RDX;
  return;
}

Assistant:

BinaryReadError(
      const std::string &filename, std::size_t offset, fmt::CStringRef message)
  : Error(message), filename_(filename), offset_(offset) {}